

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void walk_ports_recurse0(Port *p,char *name_buffer,size_t buffer_size,Ports *base,void *data,
                        port_walker_t walker,void *runtime,char *old_end,char *write_head,
                        bool expand_bundles,char *read_head,bool ranges)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *__s;
  uint uVar7;
  char *pcVar8;
  
  while( true ) {
    pcVar4 = strchr(read_head + 1,0x23);
    if (pcVar4 == (char *)0x0) {
      sVar5 = strlen(read_head);
    }
    else {
      sVar5 = (long)pcVar4 - (long)read_head;
    }
    pcVar8 = read_head;
    for (lVar6 = 0; (0 < (long)sVar5 && (read_head[lVar6] != ':')); lVar6 = lVar6 + 1) {
      write_head[lVar6] = read_head[lVar6];
      sVar5 = sVar5 - 1;
      pcVar8 = pcVar8 + 1;
    }
    __s = write_head + lVar6;
    if (pcVar4 == (char *)0x0) break;
    uVar2 = atoi(read_head + lVar6 + 1);
    do {
      cVar1 = pcVar8[1];
      pcVar8 = pcVar8 + 1;
    } while ((int)cVar1 - 0x30U < 10);
    if ((ranges & 1U) == 0) {
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        iVar3 = snprintf(__s,0x20,"%d/",(ulong)uVar7);
        walk_ports_recurse0(p,name_buffer,buffer_size,base,data,walker,runtime,old_end,__s + iVar3,
                            expand_bundles,pcVar8 + (cVar1 == '/'),false);
      }
      return;
    }
    read_head = pcVar8 + (cVar1 == '/');
    iVar3 = snprintf(__s,0x20,"[0,%d]/");
    write_head = __s + iVar3;
    ranges = true;
  }
  if (write_head[lVar6 + -1] != '/') {
    __s = write_head + lVar6 + 1;
    write_head[lVar6] = '/';
  }
  *__s = '\0';
  walk_ports_recurse(p,name_buffer,buffer_size,base,data,walker,runtime,old_end,expand_bundles,
                     (bool)(ranges & 1));
  return;
}

Assistant:

static void walk_ports_recurse0(const Port& p, char* name_buffer,
                                size_t buffer_size, const Ports* base,
                                void* data, port_walker_t walker,
                                void* runtime, char* const old_end, char* write_head,
                                bool expand_bundles, const char* read_head,
                                bool ranges)
{
    ssize_t write_space = buffer_size - (ssize_t)(write_head - name_buffer);
#ifdef NDEBUG
    (void)write_space;
#endif
    const char* hash_ptr = strchr(read_head + 1,'#');
    ssize_t to_copy = hash_ptr ? hash_ptr - read_head : strlen(read_head);

    // Check write space is sufficient
    // The formula is valid for the whole function
    assert(write_space >= to_copy + 32);
    //Append the path, until possible '#'
    //yes, there are subports with ':', e.g. ".../::i"
    while(to_copy-->0 && *read_head != ':')
    {
        *write_head++ = *read_head++;
        --write_space;
    }

    if(hash_ptr)
    {
        //Overwrite the "#.../" by "0/", "1/" ...
        assert(*read_head == '#');
        const unsigned max = atoi(++read_head);
        assert(isdigit(*read_head));
        for(;isdigit(*read_head); ++read_head) {}

        if(*read_head == '/') { ++read_head; }
        if(ranges)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"[0,%d]/", max-1);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
        else for(unsigned i=0; i<max; ++i)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"%d/",i);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
    }
    else
    {
        //Ensure last to trail with "/" before recursion
        if(write_head[-1] != '/')
            *write_head++ = '/';
        *write_head = 0;
        //Recurse
        walk_ports_recurse(p, name_buffer, buffer_size,
                           *base, data, walker, runtime, old_end,
                           expand_bundles, ranges);
    }
}